

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_3chan_planar(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  size_t __n;
  long lVar5;
  uint8_t *__dest;
  int iVar6;
  void *__src;
  uint8_t *__dest_00;
  uint8_t *__dest_01;
  
  iVar6 = (decode->chunk).height;
  if (0 < iVar6) {
    peVar4 = decode->channels;
    __dest = peVar4[2].field_12.decode_to_ptr;
    __dest_00 = (peVar4->field_12).decode_to_ptr;
    __dest_01 = peVar4[1].field_12.decode_to_ptr;
    iVar1 = peVar4[2].user_line_stride;
    iVar2 = peVar4[1].user_line_stride;
    iVar3 = peVar4->user_line_stride;
    lVar5 = (long)peVar4->width;
    __n = lVar5 * 2;
    __src = decode->unpacked_buffer;
    do {
      memcpy(__dest_00,__src,__n);
      memcpy(__dest_01,(void *)((long)__src + __n),__n);
      memcpy(__dest,(void *)(lVar5 * 4 + (long)__src),__n);
      __dest_00 = __dest_00 + iVar3;
      __dest_01 = __dest_01 + iVar2;
      __dest = __dest + iVar1;
      iVar6 = iVar6 + -1;
      __src = (void *)(lVar5 * 6 + (long)__src);
    } while (iVar6 != 0);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    // planar output
    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
                            /* specialise to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out0) + x) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out1) + x) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out2) + x) = one_to_native16 (in2[x]);
#else
        memcpy (out0, in0, (size_t) (w) * sizeof (uint16_t));
        memcpy (out1, in1, (size_t) (w) * sizeof (uint16_t));
        memcpy (out2, in2, (size_t) (w) * sizeof (uint16_t));
#endif
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}